

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZMHMeshControl *this,TPZVec<long> *coarseindices)

{
  int64_t newsize;
  int64_t nelem;
  long *plVar1;
  int64_t in_RAX;
  TPZGeoEl **ppTVar2;
  mapped_type_conflict *pmVar3;
  TPZGeoEl *this_00;
  long lVar4;
  long lVar5;
  int64_t local_38;
  
  lVar5 = coarseindices->fNElements;
  newsize = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
            fNElements;
  local_38 = in_RAX;
  TPZManVector<long,_10>::Resize(&this->fGeoToMHMDomain,newsize);
  if (0 < newsize) {
    memset((this->fGeoToMHMDomain).super_TPZVec<long>.fStore,0xff,newsize * 8);
  }
  if (0 < lVar5) {
    lVar4 = 0;
    do {
      nelem = coarseindices->fStore[lVar4];
      (this->fGeoToMHMDomain).super_TPZVec<long>.fStore[nelem] = nelem;
      ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
      if (*ppTVar2 != (TPZGeoEl *)0x0) {
        local_38 = (*ppTVar2)->fIndex;
        pmVar3 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](&this->fMHMtoSubCMesh,&local_38);
        *pmVar3 = -1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  if (0 < newsize) {
    lVar5 = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,lVar5);
      this_00 = *ppTVar2;
      if ((this_00 != (TPZGeoEl *)0x0) &&
         ((this->fGeoToMHMDomain).super_TPZVec<long>.fStore[lVar5] == -1)) {
        do {
          this_00 = TPZGeoEl::Father(this_00);
          if (this_00 == (TPZGeoEl *)0x0) goto LAB_01396520;
          plVar1 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
          lVar4 = plVar1[this_00->fIndex];
        } while (lVar4 == -1);
        plVar1[lVar5] = lVar4;
      }
LAB_01396520:
      lVar5 = lVar5 + 1;
    } while (lVar5 != newsize);
  }
  (*this->_vptr_TPZMHMeshControl[5])(this);
  return;
}

Assistant:

void TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZVec<int64_t> &coarseindices)
{
    int64_t ncoarse = coarseindices.size();
    int64_t nel = fGMesh->NElements();
    fGeoToMHMDomain.Resize(nel);
    for (int64_t el=0; el<nel; el++) {
        fGeoToMHMDomain[el] = -1;
    }
    for (int64_t el=0; el<ncoarse; el++) {
        fGeoToMHMDomain[coarseindices[el]] = coarseindices[el];
        TPZGeoEl *gel = fGMesh->Element(coarseindices[el]);
        if (gel) {
            fMHMtoSubCMesh[gel->Index()] = -1;
        }
    }
    // set the MHM domain index for all elements
    // look for a father element that has a MHM domain index
    // adopt the domain index of the ancester
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || fGeoToMHMDomain[el] != -1) {
            continue;
        }
        int domain = -1;
        TPZGeoEl *father = gel->Father();
        while (father) {
            int64_t index = father->Index();
            if (fGeoToMHMDomain[index] != -1) {
                fGeoToMHMDomain[el] = fGeoToMHMDomain[index];
                break;
            }
            father = father->Father();
        }
    }
    CreateSkeletonElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Subdomain indices " << fGeoToMHMDomain << std::endl;
        sout << "Recognized domains ";
        for (auto it = fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << it->first << ' ';
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}